

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

void __thiscall
Model::update_gaussian_multiple_kernel
          (Model *this,vector<double,_std::allocator<double>_> *labels,int centerId,
          vector<int,_std::allocator<int>_> *contextIds,double current_lr,int numOfKernels,
          double *kernelCoefficients)

{
  size_t __n;
  double dVar1;
  pointer piVar2;
  double **ppdVar3;
  double **ppdVar4;
  int d_2;
  undefined8 *puVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  ulong uVar9;
  int i;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  uVar10 = (ulong)this->dim_size;
  uVar12 = 0;
  uVar9 = -(ulong)(uVar10 == 0) | uVar10 * 8;
  puVar5 = (undefined8 *)operator_new__(uVar9);
  *puVar5 = 0;
  __n = uVar9 - 8;
  memset(puVar5 + 1,0,__n);
  puVar6 = (undefined8 *)operator_new__(uVar9);
  *puVar6 = 0;
  memset(puVar6 + 1,0,__n);
  puVar7 = (undefined8 *)operator_new__(uVar9);
  *puVar7 = 0;
  memset(puVar7 + 1,0,__n);
  puVar8 = (undefined8 *)operator_new__(uVar9);
  *puVar8 = 0;
  memset(puVar8 + 1,0,__n);
  uVar9 = 0;
  if (0 < numOfKernels) {
    uVar9 = (ulong)(uint)numOfKernels;
  }
  for (; piVar2 = (contextIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start,
      uVar12 < (ulong)((long)(contextIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar2 >> 2);
      uVar12 = uVar12 + 1) {
    ppdVar3 = this->emb0;
    ppdVar4 = this->emb1;
    for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
      puVar8[uVar11] = ppdVar4[piVar2[uVar12]][uVar11] - ppdVar3[centerId][uVar11];
    }
    dVar15 = 0.0;
    for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
      dVar15 = dVar15 + (double)puVar8[uVar11] * (double)puVar8[uVar11];
    }
    dVar16 = 0.0;
    dVar17 = 0.0;
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      dVar13 = this->kernelParams[uVar10 + 1] * this->kernelParams[uVar10 + 1];
      dVar1 = kernelCoefficients[uVar10];
      dVar14 = exp(-dVar15 / (dVar13 + dVar13));
      dVar17 = dVar17 + dVar14 * dVar1;
      dVar16 = dVar16 + (1.0 / dVar13) * dVar14 * dVar1;
    }
    dVar17 = (labels->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar12] - dVar17;
    uVar10 = (ulong)this->dim_size;
    for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
      puVar7[uVar11] = (double)puVar8[uVar11] * dVar16 * (dVar17 + dVar17);
    }
    for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
      puVar6[uVar11] = (double)puVar7[uVar11] * -current_lr;
    }
    for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
      puVar5[uVar11] = (double)puVar6[uVar11] + (double)puVar5[uVar11];
    }
    ppdVar3 = this->emb1;
    for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
      dVar15 = ppdVar3[(contextIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar12]][uVar11];
      ppdVar3[(contextIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar12]][uVar11] =
           ((double)puVar6[uVar11] - this->lambda * current_lr * dVar15) + dVar15;
    }
  }
  ppdVar3 = this->emb0;
  for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
    dVar15 = ppdVar3[centerId][uVar12];
    ppdVar3[centerId][uVar12] =
         (-this->lambda * current_lr * dVar15 - (double)puVar5[uVar12]) + dVar15;
  }
  operator_delete__(puVar5);
  operator_delete__(puVar6);
  operator_delete__(puVar8);
  operator_delete__(puVar7);
  uVar10 = 0xffffffffffffffff;
  if (0 < numOfKernels) {
    uVar10 = (ulong)(uint)numOfKernels << 3;
  }
  puVar5 = (undefined8 *)operator_new__(uVar10);
  *puVar5 = 0;
  memset(puVar5 + 1,0,uVar10 - 8);
  puVar6 = (undefined8 *)operator_new__(uVar10);
  *puVar6 = 0;
  memset(puVar6 + 1,0,uVar10 - 8);
  for (uVar10 = 0;
      uVar10 < (ulong)((long)(contextIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(contextIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start >> 2); uVar10 = uVar10 + 1) {
    dVar15 = 0.0;
    for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
      dVar16 = gaussian_kernel(this,(contextIds->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_start[uVar10],centerId,
                               this->kernelParams[uVar12 + 1]);
      puVar5[uVar12] = dVar16;
      dVar15 = dVar15 + dVar16 * kernelCoefficients[uVar12];
    }
    for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
      dVar16 = (labels->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar10] - dVar15;
      puVar6[uVar12] = (double)puVar6[uVar12] - (dVar16 + dVar16) * (double)puVar5[uVar12];
    }
  }
  for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    kernelCoefficients[uVar10] =
         ((double)puVar6[uVar10] * -current_lr -
         this->beta * current_lr * kernelCoefficients[uVar10]) + kernelCoefficients[uVar10];
  }
  operator_delete__(puVar5);
  return;
}

Assistant:

void Model::update_gaussian_multiple_kernel(vector <double> labels, int centerId, vector <int> contextIds, double current_lr, int numOfKernels, double *kernelCoefficients) {

    //for(int k=0; k<numOfKernels; k++)
    //    kernelCoefficients[k] = 1.0/numOfKernels;

    /* ----------- Update embedding vectors ----------- */
    double *neule;
    double *g, *temp_g;
    double eta, e, *diff,  *z;
    double var;
    double *e_values;

    neule = new double[this->dim_size]{0};
    g = new double[this->dim_size]{0};
    temp_g = new double[this->dim_size]{0};
    z = new double[this->dim_size]{0};
    diff = new double[this->dim_size]{0};
    e_values = new double[this->dim_size]{0};
    double e_values_sum=0;
    double e_values_sum_ext=0;
    double f;

    for(int i = 0; i < contextIds.size(); i++) {

        for (int d = 0; d < this->dim_size; d++)
            diff[d] = this->emb1[contextIds[i]][d] - this->emb0[centerId][d];

        eta = 0.0;
        for (int d = 0; d < this->dim_size; d++)
            eta += diff[d]*diff[d];

        e_values_sum = 0;
        e_values_sum_ext = 0;
        for(int k=0; k < numOfKernels; k++) {
            var = this->kernelParams[k+1] * this->kernelParams[k+1];
            e_values[k] = kernelCoefficients[k] * exp( -eta/(2.0*var) );
            e_values_sum += e_values[k];
            e_values_sum_ext += e_values[k] * ( 1.0 / var );
        }

        f = 2.0 * ( labels[i]-e_values_sum  ) * ( e_values_sum_ext );
        for (int d = 0; d < this->dim_size; d++)
            z[d] = f * ( diff[d] );

        for (int d = 0; d < this->dim_size; d++)
            g[d] = -current_lr * z[d]; // minus comes from the objective function, minimization


        for (int d = 0; d < this->dim_size; d++)
            neule[d] += g[d];

        for (int d = 0; d < this->dim_size; d++)
            this->emb1[contextIds[i]][d] += g[d] - current_lr*this->lambda*(this->emb1[contextIds[i]][d]);
    }
    for (int d = 0; d < this->dim_size; d++)
        this->emb0[centerId][d] += -neule[d] - current_lr*this->lambda*(this->emb0[centerId][d]);


    delete[] neule;
    delete [] g;
    delete [] temp_g;
    delete [] diff;
    delete [] z;
    delete [] e_values;
    /* ------------------------------------------------ */
    /* ----------- Update embedding vectors ----------- */
//    neule = new double[this->dim_size]{0};
//    g = new double[this->dim_size]{0};
//    temp_g = new double[this->dim_size]{0};
//
//
//    for(int i = 0; i < contextIds.size(); i++) {
//
//        for(int k=0; k < numOfKernels; k++) {
//
//            this->get_gaussian_grad(temp_g, labels[i], this->kernelParams[k+1], centerId, contextIds[i], current_lr);
//
//            for (int d = 0; d < this->dim_size; d++)
//                g[d] += (kernelCoefficients[k]) * temp_g[d]; // g[d] += (1.0 / numOfKernels) * temp_g[d];
//
//        }
//
//        for (int d = 0; d < this->dim_size; d++)
//            neule[d] += g[d];
//
//        for (int d = 0; d < this->dim_size; d++)
//            this->emb1[contextIds[i]][d] += g[d] - current_lr*this->lambda*(this->emb1[contextIds[i]][d]);
//    }
//    for (int d = 0; d < this->dim_size; d++)
//        this->emb0[centerId][d] += -neule[d] - current_lr*this->lambda*(this->emb0[centerId][d]);
//
//
//    delete[] neule;
//    delete [] g;
//    delete [] temp_g;
    /* ------------------------------------------------ */

    /* ---------- Update kernel coefficients ---------- */
    double kernelSum;
    double *ker, *totalKer;

    ker = new double[numOfKernels]{0};
    totalKer = new double[numOfKernels]{0};

    for(int i = 0; i < contextIds.size(); i++) {
        kernelSum = 0;
        for (int k = 0; k < numOfKernels; k++) {
            ker[k] = this->gaussian_kernel(contextIds[i], centerId, this->kernelParams[k + 1]);
            kernelSum += kernelCoefficients[k] * ker[k];
        }
        for (int k = 0; k < numOfKernels; k++)
            totalKer[k] += 2.0 * ( labels[i] - kernelSum ) * -ker[k];
    }

    for (int k = 0; k < numOfKernels; k++) {
        kernelCoefficients[k] += -current_lr * totalKer[k] - current_lr * this->beta * kernelCoefficients[k];
        //cout << kernelCoefficients[k] << " ";
    }
    //cout << endl;
    delete[] ker;
    /* ------------------------------------------------ */

}